

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

void __thiscall BeliefSparse::Set(BeliefSparse *this)

{
  BeliefInterface *in_stack_00000058;
  BeliefSparse *in_stack_00000060;
  
  Set(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void BeliefSparse::Set(const BeliefInterface &belief)
{
    _m_b.resize(belief.Size(),false);
    _m_b.clear();

    for(unsigned int i=0; i!=belief.Size(); ++i)
    {
        if(belief.Get(i)>0)
            _m_b[i]=belief.Get(i);
    }
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}